

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

int txt_np(char *dest,int sd)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  distribution *s;
  char *pcVar5;
  int iVar6;
  char syntax [13];
  char local_3d [13];
  
  pcVar3 = local_3d;
  pick_str(&np,sd,pcVar3);
  iVar6 = 0;
  while( true ) {
    pcVar3 = strtok(pcVar3," ");
    if (pcVar3 == (char *)0x0) break;
    cVar1 = *pcVar3;
    if (cVar1 == 'N') {
      s = &nouns;
    }
    else if (cVar1 == 'D') {
      s = &adverbs;
    }
    else if (cVar1 == 'J') {
      s = &adjectives;
    }
    else if (cVar1 == 'A') {
      s = &articles;
    }
    else {
      s = (distribution *)0x0;
    }
    iVar2 = pick_str(s,sd,dest);
    sVar4 = strlen(s->list[iVar2].text);
    pcVar5 = dest + (int)sVar4;
    iVar6 = iVar6 + (int)sVar4;
    if (pcVar3[1] != '\0') {
      *pcVar5 = pcVar3[1];
      pcVar5 = pcVar5 + 1;
      iVar6 = iVar6 + 1;
    }
    *pcVar5 = ' ';
    dest = pcVar5 + 1;
    iVar6 = iVar6 + 1;
    pcVar3 = (char *)0x0;
  }
  return iVar6;
}

Assistant:

static int
txt_np(char *dest, int sd) 
{
	char syntax[MAX_GRAMMAR_LEN + 1],
		*cptr,
		*parse_target;
	distribution *src;
	int i,
		res = 0;

	
	pick_str(&np, sd, &syntax[0]);
	parse_target = syntax;
	while ((cptr = strtok(parse_target, " ")) != NULL)
	{
		src = NULL;
		switch(*cptr)
		{
		case 'A':
			src = &articles;
			break;
		case 'J':
			src = &adjectives;
			break;
		case 'D':
			src = &adverbs;
			break;
		case 'N': 
			src = &nouns;
			break;
		}	/* end of POS switch statement */
		i = pick_str(src, sd, dest);
		i = strlen(DIST_MEMBER(src, i));
		dest += i;
		res += i;
		if (*(++cptr))	/* miscelaneous fillagree, like punctuation */
		{
			*dest = *cptr;
			dest += 1;
			res += 1;
		}
		*dest = ' ';
		dest++;
		res++;
		parse_target = NULL;
	}	/* end of while loop */

	return(res);
}